

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

void arkInterpFree_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I)

{
  void *__ptr;
  int iVar1;
  int *__ptr_00;
  long lVar2;
  long lVar3;
  int iVar5;
  undefined1 auVar4 [16];
  
  if (I != (ARKInterp)0x0) {
    __ptr_00 = (int *)I->content;
    if (__ptr_00 != (int *)0x0) {
      __ptr = *(void **)(__ptr_00 + 2);
      if (__ptr != (void *)0x0) {
        iVar1 = *__ptr_00;
        if (0 < iVar1) {
          lVar3 = 0;
          lVar2 = 0;
          do {
            if (*(long *)(*(long *)(__ptr_00 + 2) + lVar3) != 0) {
              arkFreeVec(ark_mem,(N_Vector *)(*(long *)(__ptr_00 + 2) + lVar3));
              *(undefined8 *)(*(long *)((long)I->content + 8) + lVar3) = 0;
              __ptr_00 = (int *)I->content;
              iVar1 = *__ptr_00;
            }
            lVar2 = lVar2 + 1;
            lVar3 = lVar3 + 8;
          } while (lVar2 < iVar1);
          __ptr = *(void **)(__ptr_00 + 2);
        }
        free(__ptr);
        __ptr_00 = (int *)I->content;
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      if (*(void **)(__ptr_00 + 4) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 4));
        __ptr_00 = (int *)I->content;
        __ptr_00[4] = 0;
        __ptr_00[5] = 0;
      }
      iVar5 = *__ptr_00 + 1;
      auVar4._4_4_ = *__ptr_00 + 2;
      auVar4._8_4_ = auVar4._4_4_;
      auVar4._12_4_ = -(uint)(auVar4._4_4_ < 0);
      ark_mem->lrw = ark_mem->lrw - CONCAT44(-(uint)(iVar5 < 0),iVar5);
      ark_mem->liw = ark_mem->liw - auVar4._8_8_;
      free(__ptr_00);
      I->content = (void *)0x0;
    }
    if (I->ops != (ARKInterpOps)0x0) {
      free(I->ops);
    }
    free(I);
    return;
  }
  return;
}

Assistant:

void arkInterpFree_Lagrange(ARKodeMem ark_mem, ARKInterp I)
{
  int i;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) { return; }

  /* free content */
  if (I->content != NULL)
  {
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAX(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops)
  {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}